

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::Decode
          (IntercomCommunicationParameters *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *this_01;
  EntityDestinationRecord *this_02;
  GroupDestinationRecord *this_03;
  GroupAssignmentRecord *this_04;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  IntercomCommunicationParameters *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (3 < KVar1) {
    this_01 = KDataStream::operator>>(local_18,&this->m_ui16Type);
    KDataStream::operator>>(this_01,&this->m_ui16Length);
    if (((this->m_pRecord != (DataTypeBase *)0x0) && ((this->m_bMemoryManage & 1U) != 0)) &&
       (this->m_pRecord != (DataTypeBase *)0x0)) {
      (*this->m_pRecord->_vptr_DataTypeBase[1])();
    }
    this->m_bMemoryManage = true;
    KVar1 = this->m_ui16Type;
    if (KVar1 == 1) {
      this_02 = (EntityDestinationRecord *)operator_new(0x20);
      EntityDestinationRecord::EntityDestinationRecord(this_02,local_18);
      this->m_pRecord = (DataTypeBase *)this_02;
      this->m_ui16Length = 0xc;
    }
    else if (KVar1 == 2) {
      this_03 = (GroupDestinationRecord *)operator_new(0x10);
      GroupDestinationRecord::GroupDestinationRecord(this_03,local_18);
      this->m_pRecord = (DataTypeBase *)this_03;
      this->m_ui16Length = 8;
    }
    else if (KVar1 == 3) {
      this_04 = (GroupAssignmentRecord *)operator_new(0x28);
      GroupAssignmentRecord::GroupAssignmentRecord(this_04,local_18);
      this->m_pRecord = (DataTypeBase *)this_04;
      this->m_ui16Length = 0x10;
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void IntercomCommunicationParameters::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < IntercomCommunicationParameters::INTERCOM_COMMS_PARAM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16Type
           >> m_ui16Length;

    if( m_pRecord && m_bMemoryManage )delete m_pRecord;

    m_bMemoryManage = true;

    switch( m_ui16Type )
    {
    case EntityDestinationRecord_Type:
        m_pRecord = new EntityDestinationRecord( stream );
        m_ui16Length = EntityDestinationRecord::ENTITY_DESTINATION_RECORD_SIZE;
        break;

    case GroupDestinationRecord_Type:
        m_pRecord = new GroupDestinationRecord( stream );
        m_ui16Length = GroupDestinationRecord::GROUP_DESTINATION_RECORD_SIZE;
        break;

    case GroupAssignmentRecord_Type:
        m_pRecord = new GroupAssignmentRecord( stream );
        m_ui16Length = GroupAssignmentRecord::GROUP_ASSIGNMENT_RECORD_SIZE;
        break;
    }
}